

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O0

void ImGui_ImplSDL2_Shutdown(void)

{
  ImGuiMouseCursor cursor_n;
  int local_4;
  
  g_Window = (SDL_Window *)0x0;
  if (g_ClipboardTextData != (char *)0x0) {
    SDL_free(g_ClipboardTextData);
  }
  g_ClipboardTextData = (char *)0x0;
  for (local_4 = 0; local_4 < 9; local_4 = local_4 + 1) {
    SDL_FreeCursor(g_MouseCursors[local_4]);
  }
  memset(g_MouseCursors,0,0x48);
  return;
}

Assistant:

void ImGui_ImplSDL2_Shutdown()
{
    g_Window = NULL;

    // Destroy last known clipboard data
    if (g_ClipboardTextData)
        SDL_free(g_ClipboardTextData);
    g_ClipboardTextData = NULL;

    // Destroy SDL mouse cursors
    for (ImGuiMouseCursor cursor_n = 0; cursor_n < ImGuiMouseCursor_COUNT; cursor_n++)
        SDL_FreeCursor(g_MouseCursors[cursor_n]);
    memset(g_MouseCursors, 0, sizeof(g_MouseCursors));
}